

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_tiles
          (exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,char *tname
          ,int32_t attrsz)

{
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  exr_result_t eVar4;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  uint8_t rnd;
  uint8_t lev;
  char *in_stack_00000008;
  exr_attr_tiledesc_t tmpdata;
  exr_result_t rv;
  uint32_t local_39;
  uint32_t uStack_35;
  byte local_31;
  int local_30;
  int local_2c;
  char *local_28;
  long local_20;
  long local_18;
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_39,0,9);
  iVar3 = strcmp(local_28,"tiledesc");
  if (iVar3 == 0) {
    if (local_2c == 9) {
      local_30 = (**(code **)(local_20 + 0x20))(local_20,&local_39,9);
      if (local_30 == 0) {
        local_39 = one_to_native32(0);
        uStack_35 = one_to_native32(0);
        bVar2 = (byte)((int)(uint)local_31 >> 4);
        if ((local_31 & 0xf) < 3) {
          if (bVar2 < 2) {
            if (*(long *)(local_18 + 0x60) == 0) {
              local_30 = exr_attr_list_add_static_name
                                   ((exr_context_t)CONCAT44(attrsz,rv),
                                    (exr_attribute_list_t *)tmpdata._1_8_,in_stack_00000008,
                                    unaff_retaddr_00,unaff_retaddr,
                                    (uint8_t **)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (exr_attribute_t **)curpart);
              if (local_30 == 0) {
                puVar1 = *(undefined8 **)(*(long *)(local_18 + 0x60) + 0x18);
                *puVar1 = CONCAT44(uStack_35,local_39);
                *(byte *)(puVar1 + 1) = local_31;
                eVar4 = 0;
              }
              else {
                eVar4 = (**(code **)(local_10 + 0x48))
                                  (local_10,local_30,
                                   "Unable to initialize attribute \'%s\', type \'tiledesc\'",
                                   "tiles");
              }
            }
            else if (*(char *)(local_10 + 6) == '\0') {
              puVar1 = *(undefined8 **)(*(long *)(local_18 + 0x60) + 0x18);
              *puVar1 = CONCAT44(uStack_35,local_39);
              *(byte *)(puVar1 + 1) = local_31;
              eVar4 = 0;
            }
            else {
              eVar4 = (**(code **)(local_10 + 0x48))
                                (local_10,0xe,
                                 "Duplicate copy of required attribute \'tiles\' encountered");
            }
          }
          else {
            eVar4 = (**(code **)(local_10 + 0x48))
                              (local_10,0xe,"Invalid rounding mode (%d) in tile description header",
                               bVar2);
          }
        }
        else {
          eVar4 = (**(code **)(local_10 + 0x48))
                            (local_10,0xe,"Invalid level mode (%d) in tile description header",
                             local_31 & 0xf);
        }
      }
      else {
        eVar4 = (**(code **)(local_10 + 0x40))(local_10,local_30,"Unable to read \'tiles\' data");
      }
    }
    else {
      (**(code **)(local_20 + 0x28))(local_20,local_2c);
      eVar4 = (**(code **)(local_10 + 0x48))
                        (local_10,0x10,"Required attribute \'tiles\': Invalid size %d (exp %lu)",
                         local_2c,9);
    }
  }
  else {
    (**(code **)(local_20 + 0x28))(local_20,local_2c);
    eVar4 = (**(code **)(local_10 + 0x48))
                      (local_10,0x10,"Required attribute \'tiles\': Invalid type \'%s\'",local_28);
  }
  return eVar4;
}

Assistant:

static exr_result_t
check_populate_tiles (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t        rv;
    exr_attr_tiledesc_t tmpdata = {0};
    uint8_t             lev, rnd;

    if (0 != strcmp (tname, "tiledesc"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute 'tiles': Invalid type '%s'",
            tname);
    }

    if (attrsz != sizeof (exr_attr_tiledesc_t))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute 'tiles': Invalid size %d (exp %" PRIu64 ")",
            attrsz,
            (uint64_t) sizeof (exr_attr_tiledesc_t));
    }

    rv = scratch->sequential_read (scratch, &tmpdata, sizeof (tmpdata));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (ctxt, rv, "Unable to read 'tiles' data");

    tmpdata.x_size = one_to_native32 (tmpdata.x_size);
    tmpdata.y_size = one_to_native32 (tmpdata.y_size);

    lev = tmpdata.level_and_round & 0xF;
    rnd = (tmpdata.level_and_round >> 4) & 0xF;
    if (lev >= (uint8_t)EXR_TILE_LAST_TYPE)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Invalid level mode (%d) in tile description header",
            (int) lev);
    }
    if (rnd >= (uint8_t)EXR_TILE_ROUND_LAST_TYPE)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Invalid rounding mode (%d) in tile description header",
            (int) rnd);
    }

    if (curpart->tiles)
    {
        if (ctxt->strict_header)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Duplicate copy of required attribute 'tiles' encountered");
        }

        /* legacy code allowed attributes to just overwrite, preserve
         * that behavior (barring other failure)
         */
        *(curpart->tiles->tiledesc) = tmpdata;
        return EXR_ERR_SUCCESS;
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_TILES_STR,
        EXR_ATTR_TILEDESC,
        0,
        NULL,
        &(curpart->tiles));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'tiledesc'",
            EXR_REQ_TILES_STR);

    *(curpart->tiles->tiledesc) = tmpdata;
    return rv;
}